

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O0

void pretty_print(string *filename)

{
  byte bVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_4c0;
  char d;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string local_488 [8];
  string s;
  string local_468 [8];
  string buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  undefined1 local_418 [8];
  ofstream of;
  ifstream local_218 [8];
  ifstream f;
  string *filename_local;
  
  std::ifstream::ifstream(local_218,filename,8);
  std::operator+(local_438,(char *)filename);
  std::ofstream::ofstream(local_418,local_438,0x10);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::string(local_468);
  while( true ) {
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) break;
    read_exp(local_218,(string *)local_468);
    std::__cxx11::string::string((string *)&__range2,local_468);
    util::pprint(local_488,&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_4c0._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffb40);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&__end2);
      std::ostream::put((char)local_418);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string(local_488);
  }
  std::ifstream::close();
  std::ofstream::close();
  std::__cxx11::string::~string(local_468);
  std::ofstream::~ofstream(local_418);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void pretty_print(const std::string &filename) {

  std::ifstream f(filename);
  std::ofstream of(filename + "___");
  std::string buf;

  while (f.good()) {
    read_exp(f, buf);
    std::string s = util::pprint(buf);
    for (auto d : s) {
      of.put(d);
    }
  }

  f.close();
  of.close();

}